

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

wrapper<boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>_&&,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>_>_>
 __thiscall
boost::ext::di::v1_3_0::core::
injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::override,boost::ext::di::v1_3_0::core::none>>
::
create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,false>,boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,std::default_delete<iclient>>,std::unique_ptr<user,std::default_delete<iclient>>,std::unique_ptr<timer,std::default_delete<iclient>>>&&,boost::ext::di::v1_3_0::no_name>
          (injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::__0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::override,boost::ext::di::v1_3_0::core::none>>
           *this)

{
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_bindings_override_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_boost::ext::di::v1_3_0::core::override,_boost::ext::di::v1_3_0::core::none>_>
  *in_RSI;
  wrapper_conflict3 wVar1;
  wrapper<boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>_&&,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>_>_>
  wVar2;
  dependency__<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>,_boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *creatable_dept;
  provider<boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_bindings_override_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_boost::ext::di::v1_3_0::core::override,_boost::ext::di::v1_3_0::core::none>_>_>
  *local_20;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>,_boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *dependency;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_bindings_override_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_boost::ext::di::v1_3_0::core::override,_boost::ext::di::v1_3_0::core::none>_>
  *this_local;
  
  this_local = (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_bindings_override_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_boost::ext::di::v1_3_0::core::override,_boost::ext::di::v1_3_0::core::none>_>
                *)this;
  binder::
  resolve<boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,std::default_delete<iclient>>,std::unique_ptr<user,std::default_delete<iclient>>,std::unique_ptr<timer,std::default_delete<iclient>>>&&,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,std::default_delete<iclient>>,std::unique_ptr<user,std::default_delete<iclient>>,std::unique_ptr<timer,std::default_delete<iclient>>>,boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,std::default_delete<iclient>>,std::unique_ptr<user,std::default_delete<iclient>>,std::unique_ptr<timer,std::default_delete<iclient>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::__0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::override,boost::ext::di::v1_3_0::core::none>>>
            (in_RSI);
  local_20 = (provider<boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_bindings_override_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_boost::ext::di::v1_3_0::core::override,_boost::ext::di::v1_3_0::core::none>_>_>
              *)((long)&creatable_dept + 7);
  wVar1 = scopes::deduce::
          scope<boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,std::default_delete<iclient>>,std::unique_ptr<user,std::default_delete<iclient>>,std::unique_ptr<timer,std::default_delete<iclient>>>,boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,std::default_delete<iclient>>,std::unique_ptr<user,std::default_delete<iclient>>,std::unique_ptr<timer,std::default_delete<iclient>>>>
          ::
          create<boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,std::default_delete<iclient>>,std::unique_ptr<user,std::default_delete<iclient>>,std::unique_ptr<timer,std::default_delete<iclient>>>&&,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,std::default_delete<iclient>>,std::unique_ptr<user,std::default_delete<iclient>>,std::unique_ptr<timer,std::default_delete<iclient>>>,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<std::unique_ptr<user,std::default_delete<iclient>>,std::unique_ptr<timer,std::default_delete<iclient>>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::__0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::override,boost::ext::di::v1_3_0::core::none>>>>
                    ((scope<boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,std::default_delete<iclient>>,std::unique_ptr<user,std::default_delete<iclient>>,std::unique_ptr<timer,std::default_delete<iclient>>>,boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,std::default_delete<iclient>>,std::unique_ptr<user,std::default_delete<iclient>>,std::unique_ptr<timer,std::default_delete<iclient>>>>
                      *)this,local_20);
  wVar2.wrapper_.object.array[1]._M_t.super___uniq_ptr_impl<iclient,_std::default_delete<iclient>_>.
  _M_t.super__Tuple_impl<0UL,_iclient_*,_std::default_delete<iclient>_>.
  super__Head_base<0UL,_iclient_*,_false>._M_head_impl =
       wVar1.object.array[1]._M_t.super___uniq_ptr_impl<iclient,_std::default_delete<iclient>_>._M_t
       .super__Tuple_impl<0UL,_iclient_*,_std::default_delete<iclient>_>.
       super__Head_base<0UL,_iclient_*,_false>._M_head_impl;
  wVar2.wrapper_.object.array[0]._M_t.super___uniq_ptr_impl<iclient,_std::default_delete<iclient>_>.
  _M_t.super__Tuple_impl<0UL,_iclient_*,_std::default_delete<iclient>_>.
  super__Head_base<0UL,_iclient_*,_false>._M_head_impl =
       (__uniq_ptr_data<iclient,_std::default_delete<iclient>,_true,_true>)
       (__uniq_ptr_data<iclient,_std::default_delete<iclient>,_true,_true>)this;
  return (wrapper<boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>_&&,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_boost::ext::di::v1_3_0::core::array_impl<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::unique_ptr<user,_std::default_delete<iclient>_>,_std::unique_ptr<timer,_std::default_delete<iclient>_>_>_>_>
          )wVar2.wrapper_.object.array;
}

Assistant:

auto create_successful_impl__() const {
    auto&& dependency = binder::resolve<T, TName>((injector*)this);
    using dependency_t = typename aux::remove_reference<decltype(dependency)>::type;
    using ctor_t = typename type_traits::ctor_traits__<binder::resolve_template_t<injector, typename dependency_t::given>, T,
                                                       typename dependency_t::ctor>::type;
    using provider_t = successful::provider<ctor_t, injector>;
    auto& creatable_dept = static_cast<dependency__<dependency_t>&>(dependency);
    using wrapper_t = decltype(creatable_dept.template create<T, TName>(provider_t{this}));
    using create_t = referable_t<T, config, dependency__<dependency_t>>;
    return successful::wrapper<create_t, wrapper_t>{creatable_dept.template create<T, TName>(provider_t{this})};
  }